

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_isResolvedUnitsWithNonExistentChild_Test::TestBody
          (Importer_isResolvedUnitsWithNonExistentChild_Test *this)

{
  byte bVar1;
  AssertHelper local_70 [8];
  Message local_68 [8];
  UnitsPtr units;
  char *local_50 [4];
  AssertionResult gtest_ar_;
  ModelPtr model;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"model",(allocator<char> *)&units);
  libcellml::Model::create((string *)&model);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"units",(allocator<char> *)&gtest_ar_);
  libcellml::Units::create((string *)&units);
  std::__cxx11::string::~string((string *)local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_50,"bumble",(allocator<char> *)&gtest_ar_);
  libcellml::Units::addUnit
            ((string *)units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  std::__cxx11::string::~string((string *)local_50);
  libcellml::Model::addUnits
            ((shared_ptr *)
             model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  bVar1 = libcellml::Units::requiresImports();
  gtest_ar_.success_ = (bool)(bVar1 ^ 1);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar1 != 0) {
    testing::Message::Message(local_68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_50,&gtest_ar_.success_,"units->requiresImports()","true");
    testing::internal::AssertHelper::AssertHelper
              (local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/importer/importer.cpp"
               ,0x396,local_50[0]);
    testing::internal::AssertHelper::operator=(local_70,local_68);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    std::__cxx11::string::~string((string *)local_50);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_68);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&units.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Importer, isResolvedUnitsWithNonExistentChild)
{
    auto model = libcellml::Model::create("model");
    auto units = libcellml::Units::create("units");
    units->addUnit("bumble");

    model->addUnits(units);

    EXPECT_FALSE(units->requiresImports());
}